

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_adaptive_eval_grid.h
# Opt level: O1

bool embree::sse2::
     stitch_row<embree::sse2::PatchEvalGrid,embree::PatchT<embree::Vec3fa,embree::Vec3fa>::Ref>
               (Ref *patch,int subPatch,bool bottom,uint x0,uint x1,int fine_x,int coarse_x,
               float *Px,float *Py,float *Pz,float *U,float *V,float *Nx,float *Ny,float *Nz,
               uint dy0,uint dwidth,uint dheight)

{
  size_t size;
  int iVar1;
  int iVar2;
  int iVar3;
  float *pfVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  float *pfVar8;
  float *pfVar9;
  StackArray<float,_128UL> ny;
  StackArray<float,_128UL> nx;
  StackArray<float,_128UL> v;
  StackArray<float,_128UL> u;
  StackArray<float,_128UL> nz;
  StackArray<float,_128UL> pz;
  StackArray<float,_128UL> py;
  float local_700 [32];
  float *local_680;
  ulong local_678;
  float local_640 [32];
  float *local_5c0;
  ulong local_5b8;
  undefined1 local_580 [128];
  undefined1 *local_500;
  ulong local_4f8;
  undefined1 local_4c0 [128];
  undefined1 *local_440;
  ulong local_438;
  float local_400 [32];
  float *local_380;
  ulong local_378;
  undefined1 local_340 [128];
  undefined1 *local_2c0;
  ulong local_2b8;
  undefined1 local_280 [128];
  undefined1 *local_200;
  ulong local_1f8;
  undefined1 local_1c0 [128];
  undefined1 *local_140;
  ulong local_138;
  PatchEvalGrid local_e8;
  
  if (fine_x == coarse_x) goto LAB_00e474e7;
  iVar2 = (x0 * 2 + 1) * coarse_x;
  iVar1 = fine_x * 2;
  iVar7 = iVar2 / iVar1;
  iVar3 = (int)((x1 * 2 + 1) * coarse_x) / iVar1;
  uVar6 = (iVar3 - iVar7) + 5;
  local_678 = (ulong)uVar6;
  size = local_678 * 4;
  local_5b8 = local_678;
  local_4f8 = local_678;
  local_438 = local_678;
  local_378 = local_678;
  local_2b8 = local_678;
  local_1f8 = local_678;
  local_138 = local_678;
  if (uVar6 < 0x21) {
    local_140 = local_1c0;
    local_200 = local_280;
    local_2c0 = local_340;
    local_440 = local_4c0;
LAB_00e47651:
    if (0x20 < uVar6) {
      local_500 = (undefined1 *)alignedMalloc(size,0x40);
      goto LAB_00e47690;
    }
    local_500 = local_580;
    local_5c0 = local_640;
LAB_00e476e3:
    if (0x20 < uVar6) {
      local_680 = (float *)alignedMalloc(size,0x40);
      goto LAB_00e47727;
    }
    local_680 = local_700;
    local_380 = local_400;
  }
  else {
    local_140 = (undefined1 *)alignedMalloc(size,0x40);
    local_200 = (undefined1 *)alignedMalloc(size,0x40);
    local_2c0 = (undefined1 *)alignedMalloc(size,0x40);
    if (0x20 < uVar6) {
      local_440 = (undefined1 *)alignedMalloc(size,0x40);
      goto LAB_00e47651;
    }
    local_440 = local_4c0;
    local_500 = local_580;
LAB_00e47690:
    if (0x20 < uVar6) {
      local_5c0 = (float *)alignedMalloc(size,0x40);
      goto LAB_00e476e3;
    }
    local_5c0 = local_640;
    local_680 = local_700;
LAB_00e47727:
    if (uVar6 < 0x21) {
      local_380 = local_400;
    }
    else {
      local_380 = (float *)alignedMalloc(size,0x40);
    }
  }
  pfVar4 = Nx;
  pfVar8 = Nx;
  pfVar9 = Nx;
  if (Nx != (float *)0x0) {
    pfVar4 = local_380;
    pfVar8 = local_680;
    pfVar9 = local_5c0;
  }
  PatchEvalGrid::PatchEvalGrid
            (&local_e8,*(undefined8 *)patch,subPatch,iVar7,iVar3,bottom,bottom,coarse_x + 1,2,
             local_140,local_200,local_2c0,local_440,local_500,pfVar9,pfVar8,pfVar4,0x1001,1);
  if (x0 <= x1) {
    uVar6 = dy0 * dwidth;
    do {
      uVar5 = (ulong)(uint)(iVar2 / iVar1 - iVar7);
      Px[uVar6] = *(float *)(local_140 + uVar5 * 4);
      Py[uVar6] = *(float *)(local_200 + uVar5 * 4);
      Pz[uVar6] = *(float *)(local_2c0 + uVar5 * 4);
      U[uVar6] = *(float *)(local_440 + uVar5 * 4);
      V[uVar6] = *(float *)(local_500 + uVar5 * 4);
      if (Nx != (float *)0x0) {
        Nx[uVar6] = local_5c0[uVar5];
        Ny[uVar6] = local_680[uVar5];
        Nz[uVar6] = local_380[uVar5];
      }
      x0 = x0 + 1;
      iVar2 = iVar2 + coarse_x * 2;
      uVar6 = uVar6 + 1;
    } while (x0 <= x1);
  }
  if (local_380 != local_400) {
    alignedFree(local_380);
  }
  if (local_680 != local_700) {
    alignedFree(local_680);
  }
  if (local_5c0 != local_640) {
    alignedFree(local_5c0);
  }
  if (local_500 != local_580) {
    alignedFree(local_500);
  }
  if (local_440 != local_4c0) {
    alignedFree(local_440);
  }
  if (local_2c0 != local_340) {
    alignedFree(local_2c0);
  }
  if (local_200 != local_280) {
    alignedFree(local_200);
  }
  if (local_140 != local_1c0) {
    alignedFree(local_140);
  }
LAB_00e474e7:
  return fine_x != coarse_x;
}

Assistant:

bool stitch_row(const Patch& patch, int subPatch, 
                      const bool bottom, const unsigned x0, const unsigned x1, const int fine_x, const int coarse_x, 
                      float* Px, float* Py, float* Pz, float* U, float* V, float* Nx, float* Ny, float* Nz, const unsigned dy0, const unsigned dwidth, const unsigned dheight)
    {
      assert(coarse_x <= fine_x);
      if (likely(fine_x == coarse_x))
	return false;
      
      const unsigned x0s = stitch(x0,fine_x,coarse_x);
      const unsigned x1s = stitch(x1,fine_x,coarse_x);
      const unsigned M = x1s-x0s+1 + VSIZEX;

      dynamic_large_stack_array(float,px,M,32*sizeof(float));
      dynamic_large_stack_array(float,py,M,32*sizeof(float));
      dynamic_large_stack_array(float,pz,M,32*sizeof(float));
      dynamic_large_stack_array(float,u,M,32*sizeof(float));
      dynamic_large_stack_array(float,v,M,32*sizeof(float));
      dynamic_large_stack_array(float,nx,M,32*sizeof(float));
      dynamic_large_stack_array(float,ny,M,32*sizeof(float));
      dynamic_large_stack_array(float,nz,M,32*sizeof(float));
      const bool has_Nxyz = Nx; assert(!Nx || (Ny && Nz));
      Eval(patch,subPatch, x0s,x1s, bottom,bottom, coarse_x+1,2, px,py,pz,u,v, 
           has_Nxyz ? (float*)nx :nullptr, has_Nxyz ? (float*)ny : nullptr , has_Nxyz ? (float*)nz : nullptr, 4097,1);
      
      for (unsigned x=x0; x<=x1; x++) 
      {
	const unsigned xs = stitch(x,fine_x,coarse_x)-x0s;
	Px[dy0*dwidth+x-x0] = px[xs];
        Py[dy0*dwidth+x-x0] = py[xs];
        Pz[dy0*dwidth+x-x0] = pz[xs];
        U [dy0*dwidth+x-x0] = u[xs];
        V [dy0*dwidth+x-x0] = v[xs];
        if (unlikely(has_Nxyz)) {
          Nx[dy0*dwidth+x-x0] = nx[xs];
          Ny[dy0*dwidth+x-x0] = ny[xs];
          Nz[dy0*dwidth+x-x0] = nz[xs];
        }
      }
      return true;
    }